

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O3

void oonf_packet_add_managed(oonf_packet_managed *managed)

{
  if ((managed->config).input_buffer_length == 0) {
    (managed->config).input_buffer = _input_buffer;
    (managed->config).input_buffer_length = 0x10000;
  }
  (managed->_if_listener).if_changed = _cb_interface_listener;
  (managed->_if_listener).name = (managed->_managed_config).interface;
  (managed->_if_listener).mesh = (managed->_managed_config).mesh;
  return;
}

Assistant:

void
oonf_packet_add_managed(struct oonf_packet_managed *managed) {
  if (managed->config.input_buffer_length == 0) {
    managed->config.input_buffer = _input_buffer;
    managed->config.input_buffer_length = sizeof(_input_buffer);
  }

  managed->_if_listener.if_changed = _cb_interface_listener;
  managed->_if_listener.name = managed->_managed_config.interface;
  managed->_if_listener.mesh = managed->_managed_config.mesh;
}